

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::PickerPrivate::minimumSizeHint(PickerPrivate *this,QStyleOption *opt)

{
  int iVar1;
  int extraout_var;
  QSize QVar2;
  int extraout_var_00;
  QLatin1String latin1;
  QArrayDataPointer<char16_t> local_30;
  
  latin1.m_data = "A";
  latin1.m_size = 1;
  QString::QString((QString *)&local_30,latin1);
  QFontMetrics::boundingRect((QString *)(opt + 0x20));
  this->stringHeight = (extraout_var_00 - extraout_var) + 1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  iVar1 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar1 * 3;
  this->itemTopMargin = this->stringHeight / 3;
  iVar1 = QFontMetrics::averageCharWidth();
  QVar2.ht = (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin;
  QVar2.wd = (this->minStringLength + 2) * iVar1 + this->itemSideMargin * 2;
  return QVar2;
}

Assistant:

QSize
PickerPrivate::minimumSizeHint( const QStyleOption & opt )
{
	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	itemTopMargin = stringHeight / 3;

	const int minStringWidth = opt.fontMetrics.averageCharWidth() *
		( minStringLength + 2 );
	const int widgetWidth = minStringWidth + 2 * itemSideMargin;
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}